

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

void __thiscall Lexer::EatWhitespace(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar2 = (byte *)this->ofs_;
  do {
    this->ofs_ = (char *)pbVar2;
    if ((char)""[*pbVar2] < '\0') {
      do {
        pbVar1 = pbVar2 + 1;
        pbVar3 = pbVar2 + 1;
        pbVar2 = pbVar3;
      } while ((char)""[*pbVar1] < '\0');
      bVar4 = false;
    }
    else {
      pbVar3 = pbVar2 + 1;
      bVar4 = true;
      if (*pbVar2 == 0x24) {
        if (*pbVar3 == 0xd) {
          bVar4 = pbVar2[2] != 10;
          if (!bVar4) {
            pbVar3 = pbVar2 + 3;
          }
        }
        else if (*pbVar3 == 10) {
          bVar4 = false;
          pbVar3 = pbVar2 + 2;
        }
      }
    }
    pbVar2 = pbVar3;
  } while (!bVar4);
  return;
}

Assistant:

void Lexer::EatWhitespace() {
  const char* p = ofs_;
  const char* q;
  for (;;) {
    ofs_ = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		128,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
	};
	yych = *p;
	if (yybm[0+yych] & 128) {
		goto yy79;
	}
	if (yych <= 0x00) goto yy75;
	if (yych == '$') goto yy82;
	goto yy77;
yy75:
	++p;
	{ break; }
yy77:
	++p;
yy78:
	{ break; }
yy79:
	++p;
	yych = *p;
	if (yybm[0+yych] & 128) {
		goto yy79;
	}
	{ continue; }
yy82:
	yych = *(q = ++p);
	if (yych == '\n') goto yy83;
	if (yych == '\r') goto yy85;
	goto yy78;
yy83:
	++p;
	{ continue; }
yy85:
	yych = *++p;
	if (yych == '\n') goto yy87;
	p = q;
	goto yy78;
yy87:
	++p;
	{ continue; }
}

  }
}